

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

string * __thiscall
iDynTree::Transform::toString_abi_cxx11_(string *__return_storage_ptr__,Transform *this)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  Rotation::toString_abi_cxx11_(&local_1c8,&this->rot);
  poVar1 = std::operator<<(local_198,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1," ");
  Position::toString_abi_cxx11_(&sStack_1e8,&this->pos);
  std::operator<<(poVar1,(string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::endl<char,std::char_traits<char>>(local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Transform::toString() const
{
    std::stringstream ss;

    ss << rot.toString() << " "
       << pos.toString();

    ss << std::endl;

    return ss.str();
}